

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O0

string * __thiscall
cmGlobalNinjaGenerator::OrderDependsTargetForTarget
          (string *__return_storage_ptr__,cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,
          string *param_2)

{
  string *str;
  cmAlphaNum local_88;
  cmAlphaNum local_58;
  string *local_28;
  string *param_2_local;
  cmGeneratorTarget *target_local;
  cmGlobalNinjaGenerator *this_local;
  
  local_28 = param_2;
  param_2_local = (string *)target;
  target_local = (cmGeneratorTarget *)this;
  this_local = (cmGlobalNinjaGenerator *)__return_storage_ptr__;
  cmAlphaNum::cmAlphaNum(&local_58,"cmake_object_order_depends_target_");
  str = cmGeneratorTarget::GetName_abi_cxx11_((cmGeneratorTarget *)param_2_local);
  cmAlphaNum::cmAlphaNum(&local_88,str);
  cmStrCat<>(__return_storage_ptr__,&local_58,&local_88);
  return __return_storage_ptr__;
}

Assistant:

std::string cmGlobalNinjaGenerator::OrderDependsTargetForTarget(
  cmGeneratorTarget const* target, const std::string& /*config*/) const
{
  return cmStrCat("cmake_object_order_depends_target_", target->GetName());
}